

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O1

Image * rw::Image::create(int32 width,int32 height,int32 depth)

{
  Image *pIVar1;
  uint uVar2;
  
  allocLocation =
       "file: /workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/image.cpp line: 53";
  pIVar1 = (Image *)(*Engine::memfuncs)(0x28,0x30018);
  if (pIVar1 == (Image *)0x0) {
    create();
    pIVar1 = (Image *)0x0;
  }
  else {
    numAllocated = numAllocated + 1;
    pIVar1->flags = 0;
    pIVar1->width = width;
    pIVar1->height = height;
    pIVar1->depth = depth;
    uVar2 = 1;
    if (7 < depth) {
      uVar2 = (uint)depth >> 3;
    }
    pIVar1->bpp = uVar2;
    *(undefined8 *)&pIVar1->stride = 0;
    *(undefined8 *)((long)&pIVar1->pixels + 4) = 0;
    *(undefined4 *)((long)&pIVar1->palette + 4) = 0;
  }
  return pIVar1;
}

Assistant:

Image*
Image::create(int32 width, int32 height, int32 depth)
{
	Image *img = (Image*)rwMalloc(sizeof(Image), MEMDUR_EVENT | ID_IMAGE);
	if(img == nil){
		RWERROR((ERR_ALLOC, sizeof(Image)));
		return nil;
	}
	numAllocated++;
	img->flags = 0;
	img->width = width;
	img->height = height;
	img->depth = depth;
	img->bpp = depth < 8 ? 1 : depth/8;
	img->stride = 0;
	img->pixels = nil;
	img->palette = nil;
	return img;
}